

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::run(SSPMSolver *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int depth;
  _Setw _Var6;
  long lVar7;
  unsigned_long_long x;
  uintqueue *puVar8;
  ulong uVar9;
  uint *puVar10;
  size_t sVar11;
  ostream *poVar12;
  ulong uVar13;
  int local_94;
  uint64_t c;
  uint64_t _c;
  int _a;
  int _l;
  int i;
  int h1;
  int h0;
  int ml;
  int max_prio;
  SSPMSolver *this_local;
  
  lVar7 = Solver::nodecount(&this->super_Solver);
  iVar4 = Solver::priority(&this->super_Solver,(int)lVar7 + -1);
  x = Solver::nodecount(&this->super_Solver);
  iVar5 = ceil_log2(x);
  depth = iVar4 / 2 + 1;
  iVar4 = (iVar4 + 1) / 2;
  puVar8 = &this->Q;
  lVar7 = Solver::nodecount(&this->super_Solver);
  (this->Q).pointer = 0;
  if ((puVar8->queue != (uint *)0x0) && (puVar8->queue != (uint *)0x0)) {
    operator_delete__(puVar8->queue);
  }
  auVar3 = ZEXT416((uint)lVar7) * ZEXT816(4);
  uVar9 = auVar3._0_8_;
  if (auVar3._8_8_ != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar10 = (uint *)operator_new__(uVar9);
  puVar8->queue = puVar10;
  sVar11 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->dirty,sVar11);
  sVar11 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->unstable,sVar11);
  poVar12 = std::operator<<((this->super_Solver).logger,"even wants ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
  poVar12 = std::operator<<(poVar12,"-bounded adaptive ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,depth);
  poVar12 = std::operator<<(poVar12,"-counters.");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<((this->super_Solver).logger,"odd wants ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
  poVar12 = std::operator<<(poVar12,"-bounded adaptive ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar4);
  poVar12 = std::operator<<(poVar12,"-counters.");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  local_94 = iVar5;
  if ((this->bounded & 1U) != 0) {
    local_94 = 1;
  }
  for (_a = local_94; _a <= iVar5; _a = _a + 1) {
    iVar1 = this->lift_count;
    iVar2 = this->lift_attempt;
    uVar9 = Game::count_unsolved((this->super_Solver).game);
    run(this,_a,iVar4,1);
    uVar13 = Game::count_unsolved((this->super_Solver).game);
    poVar12 = std::operator<<((this->super_Solver).logger,"after odd  with k=");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,_a);
    poVar12 = std::operator<<(poVar12,", ");
    _Var6 = std::setw(9);
    poVar12 = std::operator<<(poVar12,_Var6);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_count - iVar1);
    poVar12 = std::operator<<(poVar12," lifts, ");
    _Var6 = std::setw(9);
    poVar12 = std::operator<<(poVar12,_Var6);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_attempt - iVar2);
    poVar12 = std::operator<<(poVar12," lift attempts, ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar13);
    poVar12 = std::operator<<(poVar12," unsolved left.");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    if (uVar13 == 0) break;
    run(this,_a,depth,0);
    uVar13 = Game::count_unsolved((this->super_Solver).game);
    poVar12 = std::operator<<((this->super_Solver).logger,"after even with k=");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,_a);
    poVar12 = std::operator<<(poVar12,", ");
    _Var6 = std::setw(9);
    poVar12 = std::operator<<(poVar12,_Var6);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_count - iVar1);
    poVar12 = std::operator<<(poVar12," lifts, ");
    _Var6 = std::setw(9);
    poVar12 = std::operator<<(poVar12,_Var6);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_attempt - iVar2);
    poVar12 = std::operator<<(poVar12," lift attempts, ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar13);
    poVar12 = std::operator<<(poVar12," unsolved left.");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    if ((_a == iVar5) || (uVar13 == 0)) break;
    if (uVar9 != uVar13) {
      _a = _a + -1;
    }
  }
  poVar12 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_count);
  poVar12 = std::operator<<(poVar12," lifts, ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->lift_attempt);
  poVar12 = std::operator<<(poVar12," lift attempts, max l ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,_a);
  poVar12 = std::operator<<(poVar12,".");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
SSPMSolver::run()
{
    int max_prio = priority(nodecount()-1);

    // compute ml (max l) and the h for even/odd
    int ml = ceil_log2(nodecount());
    int h0 = (max_prio/2)+1;
    int h1 = (max_prio+1)/2;

    // create datastructures
    Q.resize(nodecount());
    dirty.resize(nodecount());
    unstable.resize(nodecount());

    logger << "even wants " << ml << "-bounded adaptive " << h0 << "-counters." << std::endl;
    logger << "odd wants " << ml << "-bounded adaptive " << h1 << "-counters." << std::endl;

    // if running bounded sspm, start with 1-bounded adaptive counters
    int i = bounded ? 1 : ml;

    for (; i<=ml; i++) {
        int _l = lift_count, _a = lift_attempt;
        uint64_t _c = game.count_unsolved(), c;

        if (ODDFIRST) {
            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        } else {
            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        }

        if (i != ml) {
            // if i == ml then we are guaranteed to be done
            // otherwise check if done
            if (c == 0) break;
            if (_c != c) i--; // do not increase i if we solved vertices with current i
        } else {
            break; // do not count higher pls
        }
    }

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max l " << i << "." << std::endl;
}